

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> __thiscall
wabt::MakeUnique<wabt::ConstExpr,wabt::Const>(wabt *this,Const *args)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  byte bVar4;
  
  bVar4 = 0;
  puVar1 = (undefined8 *)operator_new(0x88);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 0xf;
  *puVar1 = &PTR__Expr_001d5e00;
  puVar3 = puVar1 + 8;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar3 = (args->loc).filename.data_;
    args = (Const *)((long)args + (ulong)bVar4 * -0x10 + 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>,_true,_true>)
         (__uniq_ptr_data<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}